

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::AttributeString(uint Attribute)

{
  undefined1 auStack_18 [4];
  uint Attribute_local;
  
  if (Attribute == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_sibling");
  }
  else if (Attribute == 2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_location");
  }
  else if (Attribute == 3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_name");
  }
  else if (Attribute == 9) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_ordering");
  }
  else if (Attribute == 0xb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_byte_size");
  }
  else if (Attribute == 0xc) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_bit_offset");
  }
  else if (Attribute == 0xd) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_bit_size");
  }
  else if (Attribute == 0x10) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_stmt_list");
  }
  else if (Attribute == 0x11) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_low_pc");
  }
  else if (Attribute == 0x12) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_high_pc");
  }
  else if (Attribute == 0x13) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_language");
  }
  else if (Attribute == 0x15) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_discr");
  }
  else if (Attribute == 0x16) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_discr_value");
  }
  else if (Attribute == 0x17) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_visibility");
  }
  else if (Attribute == 0x18) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_import");
  }
  else if (Attribute == 0x19) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_string_length");
  }
  else if (Attribute == 0x1a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_common_reference");
  }
  else if (Attribute == 0x1b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_comp_dir");
  }
  else if (Attribute == 0x1c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_const_value");
  }
  else if (Attribute == 0x1d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_containing_type");
  }
  else if (Attribute == 0x1e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_default_value");
  }
  else if (Attribute == 0x20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_inline");
  }
  else if (Attribute == 0x21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_is_optional");
  }
  else if (Attribute == 0x22) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_lower_bound");
  }
  else if (Attribute == 0x25) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_producer");
  }
  else if (Attribute == 0x27) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_prototyped");
  }
  else if (Attribute == 0x2a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_return_addr");
  }
  else if (Attribute == 0x2c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_start_scope");
  }
  else if (Attribute == 0x2e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_bit_stride");
  }
  else if (Attribute == 0x2f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_upper_bound");
  }
  else if (Attribute == 0x31) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_abstract_origin");
  }
  else if (Attribute == 0x32) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_accessibility");
  }
  else if (Attribute == 0x33) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_address_class");
  }
  else if (Attribute == 0x34) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_artificial");
  }
  else if (Attribute == 0x35) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_base_types");
  }
  else if (Attribute == 0x36) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_calling_convention");
  }
  else if (Attribute == 0x37) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_count");
  }
  else if (Attribute == 0x38) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_data_member_location");
  }
  else if (Attribute == 0x39) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_decl_column");
  }
  else if (Attribute == 0x3a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_decl_file");
  }
  else if (Attribute == 0x3b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_decl_line");
  }
  else if (Attribute == 0x3c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_declaration");
  }
  else if (Attribute == 0x3d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_discr_list");
  }
  else if (Attribute == 0x3e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_encoding");
  }
  else if (Attribute == 0x3f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_external");
  }
  else if (Attribute == 0x40) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_frame_base");
  }
  else if (Attribute == 0x41) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_friend");
  }
  else if (Attribute == 0x42) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_identifier_case");
  }
  else if (Attribute == 0x43) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_macro_info");
  }
  else if (Attribute == 0x44) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_namelist_item");
  }
  else if (Attribute == 0x45) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_priority");
  }
  else if (Attribute == 0x46) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_segment");
  }
  else if (Attribute == 0x47) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_specification");
  }
  else if (Attribute == 0x48) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_static_link");
  }
  else if (Attribute == 0x49) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_type");
  }
  else if (Attribute == 0x4a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_use_location");
  }
  else if (Attribute == 0x4b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_variable_parameter");
  }
  else if (Attribute == 0x4c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_virtuality");
  }
  else if (Attribute == 0x4d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_vtable_elem_location");
  }
  else if (Attribute == 0x4e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_allocated");
  }
  else if (Attribute == 0x4f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_associated");
  }
  else if (Attribute == 0x50) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_data_location");
  }
  else if (Attribute == 0x51) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_byte_stride");
  }
  else if (Attribute == 0x52) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_entry_pc");
  }
  else if (Attribute == 0x53) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_use_UTF8");
  }
  else if (Attribute == 0x54) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_extension");
  }
  else if (Attribute == 0x55) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_ranges");
  }
  else if (Attribute == 0x56) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_trampoline");
  }
  else if (Attribute == 0x57) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_column");
  }
  else if (Attribute == 0x58) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_file");
  }
  else if (Attribute == 0x59) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_line");
  }
  else if (Attribute == 0x5a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_description");
  }
  else if (Attribute == 0x5b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_binary_scale");
  }
  else if (Attribute == 0x5c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_decimal_scale");
  }
  else if (Attribute == 0x5d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_small");
  }
  else if (Attribute == 0x5e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_decimal_sign");
  }
  else if (Attribute == 0x5f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_digit_count");
  }
  else if (Attribute == 0x60) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_picture_string");
  }
  else if (Attribute == 0x61) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_mutable");
  }
  else if (Attribute == 0x62) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_threads_scaled");
  }
  else if (Attribute == 99) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_explicit");
  }
  else if (Attribute == 100) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_object_pointer");
  }
  else if (Attribute == 0x65) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_endianity");
  }
  else if (Attribute == 0x66) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_elemental");
  }
  else if (Attribute == 0x67) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_pure");
  }
  else if (Attribute == 0x68) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_recursive");
  }
  else if (Attribute == 0x69) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_signature");
  }
  else if (Attribute == 0x6a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_main_subprogram");
  }
  else if (Attribute == 0x6b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_data_bit_offset");
  }
  else if (Attribute == 0x6c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_const_expr");
  }
  else if (Attribute == 0x6d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_enum_class");
  }
  else if (Attribute == 0x6e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_linkage_name");
  }
  else if (Attribute == 0x6f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_string_length_bit_size");
  }
  else if (Attribute == 0x70) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_string_length_byte_size");
  }
  else if (Attribute == 0x71) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_rank");
  }
  else if (Attribute == 0x72) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_str_offsets_base");
  }
  else if (Attribute == 0x73) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_addr_base");
  }
  else if (Attribute == 0x74) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_rnglists_base");
  }
  else if (Attribute == 0x75) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_dwo_id");
  }
  else if (Attribute == 0x76) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_dwo_name");
  }
  else if (Attribute == 0x77) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_reference");
  }
  else if (Attribute == 0x78) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_rvalue_reference");
  }
  else if (Attribute == 0x79) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_macros");
  }
  else if (Attribute == 0x7a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_all_calls");
  }
  else if (Attribute == 0x7b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_all_source_calls");
  }
  else if (Attribute == 0x7c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_all_tail_calls");
  }
  else if (Attribute == 0x7d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_return_pc");
  }
  else if (Attribute == 0x7e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_value");
  }
  else if (Attribute == 0x7f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_origin");
  }
  else if (Attribute == 0x80) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_parameter");
  }
  else if (Attribute == 0x81) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_pc");
  }
  else if (Attribute == 0x82) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_tail_call");
  }
  else if (Attribute == 0x83) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_target");
  }
  else if (Attribute == 0x84) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_target_clobbered");
  }
  else if (Attribute == 0x85) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_data_location");
  }
  else if (Attribute == 0x86) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_call_data_value");
  }
  else if (Attribute == 0x87) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_noreturn");
  }
  else if (Attribute == 0x88) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_alignment");
  }
  else if (Attribute == 0x89) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_export_symbols");
  }
  else if (Attribute == 0x8a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_deleted");
  }
  else if (Attribute == 0x8b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_defaulted");
  }
  else if (Attribute == 0x8c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_loclists_base");
  }
  else if (Attribute == 0x2002) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_loop_begin");
  }
  else if (Attribute == 0x2003) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_tail_loop_begin");
  }
  else if (Attribute == 0x2004) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_epilog_begin");
  }
  else if (Attribute == 0x2005) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_loop_unroll_factor");
  }
  else if (Attribute == 0x2006) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_software_pipeline_depth");
  }
  else if (Attribute == 0x2007) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_linkage_name");
  }
  else if (Attribute == 0x2008) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_stride");
  }
  else if (Attribute == 0x2009) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_abstract_name");
  }
  else if (Attribute == 0x200a) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_clone_origin");
  }
  else if (Attribute == 0x200b) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_has_inlines");
  }
  else if (Attribute == 0x200c) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_stride_byte");
  }
  else if (Attribute == 0x200d) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_stride_elem");
  }
  else if (Attribute == 0x200e) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_ptr_dopetype");
  }
  else if (Attribute == 0x200f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_allocatable_dopetype");
  }
  else if (Attribute == 0x2010) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_assumed_shape_dopetype");
  }
  else if (Attribute == 0x2011) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_MIPS_assumed_size");
  }
  else if (Attribute == 0x2101) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_sf_names");
  }
  else if (Attribute == 0x2102) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_src_info");
  }
  else if (Attribute == 0x2103) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_mac_info");
  }
  else if (Attribute == 0x2104) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_src_coords");
  }
  else if (Attribute == 0x2105) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_body_begin");
  }
  else if (Attribute == 0x2106) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_body_end");
  }
  else if (Attribute == 0x2107) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_vector");
  }
  else if (Attribute == 0x210f) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_odr_signature");
  }
  else if (Attribute == 0x2110) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_template_name");
  }
  else if (Attribute == 0x2111) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_call_site_value");
  }
  else if (Attribute == 0x2112) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_call_site_data_value");
  }
  else if (Attribute == 0x2113) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_call_site_target");
  }
  else if (Attribute == 0x2114) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_call_site_target_clobbered");
  }
  else if (Attribute == 0x2115) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_tail_call");
  }
  else if (Attribute == 0x2116) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_all_tail_call_sites");
  }
  else if (Attribute == 0x2117) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_all_call_sites");
  }
  else if (Attribute == 0x2118) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_all_source_call_sites");
  }
  else if (Attribute == 0x2119) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_macros");
  }
  else if (Attribute == 0x2130) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_dwo_name");
  }
  else if (Attribute == 0x2131) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_dwo_id");
  }
  else if (Attribute == 0x2132) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_ranges_base");
  }
  else if (Attribute == 0x2133) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_addr_base");
  }
  else if (Attribute == 0x2134) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_pubnames");
  }
  else if (Attribute == 0x2135) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_pubtypes");
  }
  else if (Attribute == 0x2136) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_GNU_discriminator");
  }
  else if (Attribute == 0x3b11) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_property_read");
  }
  else if (Attribute == 0x3b12) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_property_write");
  }
  else if (Attribute == 0x3b13) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_property_implements");
  }
  else if (Attribute == 0x3b14) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_property_index");
  }
  else if (Attribute == 0x3b15) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_property_default");
  }
  else if (Attribute == 0x3b20) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_unit");
  }
  else if (Attribute == 0x3b21) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_class");
  }
  else if (Attribute == 0x3b22) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_record");
  }
  else if (Attribute == 0x3b23) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_metaclass");
  }
  else if (Attribute == 0x3b24) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_constructor");
  }
  else if (Attribute == 0x3b25) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_destructor");
  }
  else if (Attribute == 0x3b26) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_anonymous_method");
  }
  else if (Attribute == 0x3b27) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_interface");
  }
  else if (Attribute == 0x3b28) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_ABI");
  }
  else if (Attribute == 0x3b29) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_return");
  }
  else if (Attribute == 0x3b30) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_Delphi_frameptr");
  }
  else if (Attribute == 0x3b31) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_BORLAND_closure");
  }
  else if (Attribute == 0x3e00) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_LLVM_include_path");
  }
  else if (Attribute == 0x3e01) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_LLVM_config_macros");
  }
  else if (Attribute == 0x3e02) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_LLVM_isysroot");
  }
  else if (Attribute == 0x3e03) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_LLVM_tag_offset");
  }
  else if (Attribute == 0x3fe1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_optimized");
  }
  else if (Attribute == 0x3fe2) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_flags");
  }
  else if (Attribute == 0x3fe3) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_isa");
  }
  else if (Attribute == 0x3fe4) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_block");
  }
  else if (Attribute == 0x3fe5) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_major_runtime_vers");
  }
  else if (Attribute == 0x3fe6) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_runtime_class");
  }
  else if (Attribute == 0x3fe7) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_omit_frame_ptr");
  }
  else if (Attribute == 0x3fe8) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_property_name");
  }
  else if (Attribute == 0x3fe9) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_property_getter");
  }
  else if (Attribute == 0x3fea) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_property_setter");
  }
  else if (Attribute == 0x3feb) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_property_attribute");
  }
  else if (Attribute == 0x3fec) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_objc_complete_type");
  }
  else if (Attribute == 0x3fed) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_AT_APPLE_property");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::AttributeString(unsigned Attribute) {
  switch (Attribute) {
  default:
    return StringRef();
#define HANDLE_DW_AT(ID, NAME, VERSION, VENDOR)                                \
  case DW_AT_##NAME:                                                           \
    return "DW_AT_" #NAME;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}